

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffArrayExpr(NodeDiffComputer *this,ArrayExpr *lhs,ArrayExpr *rhs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int32_t i;
  ulong uVar4;
  
  uVar1 = (lhs->_inits)._size;
  iVar2 = uVar1 - (rhs->_inits)._size;
  if (iVar2 == 0) {
    uVar4 = 0;
    iVar3 = 0;
    while ((iVar2 = iVar3, uVar4 < uVar1 &&
           (iVar2 = diffNodes(this,&(lhs->_inits)._vals[uVar4]->super_Node,
                              &(rhs->_inits)._vals[uVar4]->super_Node), iVar2 <= this->limit))) {
      iVar3 = iVar3 + iVar2;
      uVar4 = uVar4 + 1;
      uVar1 = (lhs->_inits)._size;
    }
  }
  else {
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    iVar2 = iVar3 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar2;
}

Assistant:

int32_t diffArrayExpr(const ArrayExpr *lhs, const ArrayExpr *rhs) {
    const auto &leftInits = lhs->initializers();
    const auto &rightInits = rhs->initializers();

    if (leftInits.size() != rightInits.size())
      return sizeDiff(leftInits.size(), rightInits.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftInits.size(); ++i) {
      const Expr *l = leftInits[i];
      const Expr *r = rightInits[i];

      int32_t tmp = diffNodes(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }